

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_16ac71::ArchiveTool::createCommand(ArchiveTool *this,StringRef name)

{
  ExternalCommand *this_00;
  size_t in_RCX;
  StringRef SVar1;
  
  this_00 = (ExternalCommand *)operator_new(0x170);
  SVar1.Length = in_RCX;
  SVar1.Data = (char *)name.Length;
  llbuild::buildsystem::ExternalCommand::Command(this_00,SVar1);
  (this_00->super_Command).super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ArchiveShellCommand_00202620;
  this_00[1].super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&this_00[1].super_Command.name._M_string_length;
  this_00[1].super_Command.name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&this_00[1].super_Command.name._M_string_length = 0;
  this_00[1].super_Command.inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&this_00[1].super_Command.name.field_2 + 8) = 0;
  this_00[1].super_Command.inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Tool)._vptr_Tool = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    return llvm::make_unique<ArchiveShellCommand>(name);
  }